

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O1

uint32_t helper_madd32_suov(CPUTriCoreState *env,target_ulong_conflict r1,target_ulong_conflict r2,
                           target_ulong_conflict r3)

{
  uint32_t uVar1;
  ulong uVar2;
  uint uVar3;
  
  uVar2 = (ulong)r3 * (ulong)r1 + (ulong)r2;
  uVar3 = (uint)uVar2;
  if (uVar2 >> 0x20 == 0) {
    env->PSW_USB_V = 0;
    uVar1 = uVar3;
  }
  else {
    env->PSW_USB_V = 0x80000000;
    env->PSW_USB_SV = 0x80000000;
    uVar1 = 0xffffffff;
  }
  uVar3 = uVar3 * 2 ^ uVar3;
  env->PSW_USB_AV = uVar3;
  env->PSW_USB_SAV = env->PSW_USB_SAV | uVar3;
  return uVar1;
}

Assistant:

target_ulong helper_madd32_suov(CPUTriCoreState *env, target_ulong r1,
                                target_ulong r2, target_ulong r3)
{
    uint64_t t1 = extract64(r1, 0, 32);
    uint64_t t2 = extract64(r2, 0, 32);
    uint64_t t3 = extract64(r3, 0, 32);
    int64_t result;

    result = t2 + (t1 * t3);
    return suov32_pos(env, result);
}